

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * GetFunctionTable(ExpressionContext *ctx,SynBase *source,FunctionData *function)

{
  uint alignment;
  uint uniqueId;
  Allocator *allocator;
  ScopeData *scope;
  TypeUnsizedArray *type_00;
  bool bVar1;
  VariableData *this;
  SynIdentifier *this_00;
  VariableData *local_68;
  VariableData *variable;
  TypeUnsizedArray *pTStack_58;
  uint offset;
  TypeBase *type;
  VariableData **variable_1;
  InplaceStr vtableName;
  FunctionData *function_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  vtableName.end = (char *)function;
  bVar1 = isType<TypeAuto>(function->type->returnType);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!isType<TypeAuto>(function->type->returnType)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1ba5,
                  "ExprBase *GetFunctionTable(ExpressionContext &, SynBase *, FunctionData *)");
  }
  _variable_1 = GetFunctionTableName(ctx,(FunctionData *)vtableName.end);
  type = (TypeBase *)
         SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::find
                   (&ctx->vtableMap,(InplaceStr *)&variable_1);
  if (type == (TypeBase *)0x0) {
    pTStack_58 = ExpressionContext::GetUnsizedArrayType(ctx,ctx->typeFunctionID);
    variable._4_4_ =
         anon_unknown.dwarf_e7629::AllocateGlobalVariable
                   (ctx,source,(pTStack_58->super_TypeStruct).super_TypeBase.alignment,
                    (pTStack_58->super_TypeStruct).super_TypeBase.size);
    this = ExpressionContext::get<VariableData>(ctx);
    type_00 = pTStack_58;
    allocator = ctx->allocator;
    scope = ctx->globalScope;
    alignment = (pTStack_58->super_TypeStruct).super_TypeBase.alignment;
    this_00 = ExpressionContext::get<SynIdentifier>(ctx);
    SynIdentifier::SynIdentifier(this_00,_variable_1);
    uniqueId = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uniqueId + 1;
    VariableData::VariableData
              (this,allocator,source,scope,alignment,(TypeBase *)type_00,this_00,variable._4_4_,
               uniqueId);
    local_68 = this;
    SmallArray<VariableData_*,_4U>::push_back(&ctx->globalScope->variables,&local_68);
    SmallArray<VariableData_*,_4U>::push_back(&ctx->globalScope->allVariables,&local_68);
    SmallArray<VariableData_*,_128U>::push_back(&ctx->variables,&local_68);
    SmallArray<VariableData_*,_128U>::push_back(&ctx->vtables,&local_68);
    SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::insert
              (&ctx->vtableMap,(InplaceStr *)&variable_1,&local_68);
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprVariableAccess>(ctx);
    ExprVariableAccess::ExprVariableAccess
              ((ExprVariableAccess *)ctx_local,source,local_68->type,local_68);
  }
  else {
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprVariableAccess>(ctx);
    ExprVariableAccess::ExprVariableAccess
              ((ExprVariableAccess *)ctx_local,source,(TypeBase *)type->_vptr_TypeBase[4],
               (VariableData *)type->_vptr_TypeBase);
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* GetFunctionTable(ExpressionContext &ctx, SynBase *source, FunctionData *function)
{
	assert(!isType<TypeAuto>(function->type->returnType));

	InplaceStr vtableName = GetFunctionTableName(ctx, function);

	if(VariableData **variable = ctx.vtableMap.find(vtableName))
	{
		return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, (*variable)->type, *variable);
	}
	
	TypeBase *type = ctx.GetUnsizedArrayType(ctx.typeFunctionID);

	unsigned offset = AllocateGlobalVariable(ctx, source, type->alignment, type->size);
	VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.globalScope, type->alignment, type, new (ctx.get<SynIdentifier>()) SynIdentifier(vtableName), offset, ctx.uniqueVariableId++);

	ctx.globalScope->variables.push_back(variable);
	ctx.globalScope->allVariables.push_back(variable);

	ctx.variables.push_back(variable);

	ctx.vtables.push_back(variable);
	ctx.vtableMap.insert(vtableName, variable);

	return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, variable->type, variable);
}